

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semaphore.hpp
# Opt level: O0

bool __thiscall tf::Semaphore::_try_acquire_or_wait(Semaphore *this,Node *me)

{
  SmallVectorTemplateBase<tf::Node_*,_true> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffb8);
  local_1 = in_RDI[1].super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.
            CapacityX == (void *)0x0;
  if (local_1) {
    SmallVectorTemplateBase<tf::Node_*,_true>::push_back(in_RDI,(Node **)in_stack_ffffffffffffffb8);
  }
  else {
    in_RDI[1].super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         (void *)((long)in_RDI[1].super_SmallVectorTemplateCommon<tf::Node_*,_void>.
                        super_SmallVectorBase.CapacityX + -1);
  }
  local_1 = !local_1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x140af6);
  return local_1;
}

Assistant:

inline bool Semaphore::_try_acquire_or_wait(Node* me) {
  std::lock_guard<std::mutex> lock(_mtx);
  if(_cur_value > 0) {
    --_cur_value;
    return true;
  }
  else {
    _waiters.push_back(me);
    return false;
  }
}